

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.h
# Opt level: O1

void __thiscall
lunasvg::SVGElement::
transverse<lunasvg::Document::applyStyleSheet(std::__cxx11::string_const&)::__0>
          (SVGElement *this,anon_class_8_1_a8973817 callback)

{
  pointer pRVar1;
  pointer pDVar2;
  bool bVar3;
  int iVar4;
  RuleDataList *__range3;
  _List_node_base *p_Var5;
  Declaration *declaration;
  pointer pDVar6;
  RuleData *rule;
  pointer selector;
  SVGElement *this_00;
  
  pRVar1 = ((callback.rules)->
           super__Vector_base<lunasvg::RuleData,_std::allocator<lunasvg::RuleData>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (selector = ((callback.rules)->
                  super__Vector_base<lunasvg::RuleData,_std::allocator<lunasvg::RuleData>_>)._M_impl
                  .super__Vector_impl_data._M_start; selector != pRVar1; selector = selector + 1) {
    bVar3 = matchSelector(&selector->m_selector,this);
    if (bVar3) {
      pDVar2 = (selector->m_declarations).
               super__Vector_base<lunasvg::Declaration,_std::allocator<lunasvg::Declaration>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pDVar6 = (selector->m_declarations).
                    super__Vector_base<lunasvg::Declaration,_std::allocator<lunasvg::Declaration>_>.
                    _M_impl.super__Vector_impl_data._M_start; pDVar6 != pDVar2; pDVar6 = pDVar6 + 1)
      {
        setAttribute(this,pDVar6->specificity,pDVar6->id,&pDVar6->value);
      }
    }
  }
  p_Var5 = (this->m_children).
           super__List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var5 == (_List_node_base *)&this->m_children) {
      return;
    }
    this_00 = (SVGElement *)p_Var5[1]._M_next;
    if (this_00 == (SVGElement *)0x0) {
LAB_0011aecc:
      this_00 = (SVGElement *)0x0;
    }
    else {
      iVar4 = (*(code *)((_List_node_base *)(this_00->super_SVGNode)._vptr_SVGNode)[1]._M_prev)
                        (this_00);
      if ((char)iVar4 == '\0') goto LAB_0011aecc;
    }
    if (this_00 != (SVGElement *)0x0) {
      transverse<lunasvg::Document::applyStyleSheet(std::__cxx11::string_const&)::__0>
                (this_00,callback);
    }
    p_Var5 = p_Var5->_M_next;
  } while( true );
}

Assistant:

inline void SVGElement::transverse(T callback)
{
    callback(this);
    for(const auto& child : m_children) {
        if(auto element = toSVGElement(child)) {
            element->transverse(callback);
        }
    }
}